

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O2

int aes_ctr_init(archive_crypto_ctx *ctx,uint8_t *key,size_t key_len)

{
  int iVar1;
  EVP_CIPHER_CTX *pEVar2;
  EVP_CIPHER *pEVar3;
  
  pEVar2 = EVP_CIPHER_CTX_new();
  ctx->ctx = (EVP_CIPHER_CTX *)pEVar2;
  iVar1 = -1;
  if (pEVar2 != (EVP_CIPHER_CTX *)0x0) {
    if (key_len == 0x20) {
      pEVar3 = EVP_aes_256_ecb();
    }
    else if (key_len == 0x18) {
      pEVar3 = EVP_aes_192_ecb();
    }
    else {
      if (key_len != 0x10) {
        ctx->type = (EVP_CIPHER *)0x0;
        return -1;
      }
      pEVar3 = EVP_aes_128_ecb();
    }
    ctx->type = (EVP_CIPHER *)pEVar3;
    ctx->key_len = (uint)key_len;
    memcpy(ctx->key,key,key_len);
    ctx->nonce[0] = '\0';
    ctx->nonce[1] = '\0';
    ctx->nonce[2] = '\0';
    ctx->nonce[3] = '\0';
    ctx->nonce[4] = '\0';
    ctx->nonce[5] = '\0';
    ctx->nonce[6] = '\0';
    ctx->nonce[7] = '\0';
    ctx->nonce[8] = '\0';
    ctx->nonce[9] = '\0';
    ctx->nonce[10] = '\0';
    ctx->nonce[0xb] = '\0';
    ctx->nonce[0xc] = '\0';
    ctx->nonce[0xd] = '\0';
    ctx->nonce[0xe] = '\0';
    ctx->nonce[0xf] = '\0';
    ctx->encr_pos = 0x10;
    EVP_CIPHER_CTX_reset(ctx->ctx);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
aes_ctr_init(archive_crypto_ctx *ctx, const uint8_t *key, size_t key_len)
{
	if ((ctx->ctx = EVP_CIPHER_CTX_new()) == NULL)
		return -1;

	switch (key_len) {
	case 16: ctx->type = EVP_aes_128_ecb(); break;
	case 24: ctx->type = EVP_aes_192_ecb(); break;
	case 32: ctx->type = EVP_aes_256_ecb(); break;
	default: ctx->type = NULL; return -1;
	}

	ctx->key_len = key_len;
	memcpy(ctx->key, key, key_len);
	memset(ctx->nonce, 0, sizeof(ctx->nonce));
	ctx->encr_pos = AES_BLOCK_SIZE;
	EVP_CIPHER_CTX_init(ctx->ctx);
	return 0;
}